

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O1

int run_test_getnameinfo_basic_ip4(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  sockaddr_in *in_RCX;
  long extraout_RDX;
  uv_loop_t *unaff_RBX;
  int iVar3;
  long *plVar4;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_58 [16];
  uv_close_cb p_Stack_48;
  uv_close_cb p_Stack_40;
  uv_loop_t *puStack_38;
  uv_handle_t *puStack_28;
  code *pcStack_20;
  long local_18;
  long local_10;
  
  iVar3 = (int)&local_18;
  pcStack_20 = (code *)0x199df9;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  local_10 = (long)iVar1;
  local_18 = 0;
  if (local_10 == 0) {
    pcStack_20 = (code *)0x199e1c;
    puVar2 = uv_default_loop();
    in_RCX = &addr4;
    pcStack_20 = (code *)0x199e3c;
    iVar1 = uv_getnameinfo(puVar2,&req,getnameinfo_req,(sockaddr *)&addr4,0);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_00199ec9;
    pcStack_20 = (code *)0x199e5b;
    puVar2 = uv_default_loop();
    pcStack_20 = (code *)0x199e65;
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcStack_20 = (code *)0x199e6a;
    unaff_RBX = uv_default_loop();
    pcStack_20 = (code *)0x199e7e;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_20 = (code *)0x199e88;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_10 = 0;
    pcStack_20 = (code *)0x199e96;
    puVar2 = uv_default_loop();
    pcStack_20 = (code *)0x199e9e;
    iVar1 = uv_loop_close(puVar2);
    local_18 = (long)iVar1;
    if (local_10 == local_18) {
      pcStack_20 = (code *)0x199eb4;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_20 = (code *)0x199ec9;
    run_test_getnameinfo_basic_ip4_cold_1();
LAB_00199ec9:
    pcStack_20 = (code *)0x199ed6;
    run_test_getnameinfo_basic_ip4_cold_2();
  }
  plVar4 = &local_10;
  pcStack_20 = getnameinfo_req;
  run_test_getnameinfo_basic_ip4_cold_3();
  if (plVar4 == (long *)0x0) {
    puStack_38 = (uv_loop_t *)0x199f1d;
    getnameinfo_req_cold_4();
LAB_00199f1d:
    puStack_38 = (uv_loop_t *)0x199f2c;
    getnameinfo_req_cold_1();
LAB_00199f2c:
    puStack_38 = (uv_loop_t *)0x199f31;
    getnameinfo_req_cold_3();
  }
  else {
    pcStack_20 = (code *)(long)iVar3;
    puStack_28 = (uv_handle_t *)0x0;
    if (pcStack_20 != (code *)0x0) goto LAB_00199f1d;
    if (extraout_RDX == 0) goto LAB_00199f2c;
    if (in_RCX != (sockaddr_in *)0x0) {
      return iVar3;
    }
  }
  puStack_38 = (uv_loop_t *)run_test_getnameinfo_basic_ip4_sync;
  getnameinfo_req_cold_2();
  auStack_58._8_8_ = (uv_loop_t *)0x199f53;
  puStack_38 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  p_Stack_40 = (uv_close_cb)(long)iVar1;
  p_Stack_48 = (uv_close_cb)0x0;
  if (p_Stack_40 == (uv_close_cb)0x0) {
    auStack_58._8_8_ = (uv_loop_t *)0x199f76;
    puVar2 = uv_default_loop();
    auStack_58._8_8_ = (uv_loop_t *)0x199f91;
    iVar1 = uv_getnameinfo(puVar2,&req,(uv_getnameinfo_cb)0x0,(sockaddr *)&addr4,0);
    p_Stack_40 = (uv_close_cb)(long)iVar1;
    p_Stack_48 = (uv_close_cb)0x0;
    if (p_Stack_40 != (uv_close_cb)0x0) goto LAB_0019a057;
    p_Stack_40 = (uv_close_cb)(long)req.host[0];
    p_Stack_48 = (uv_close_cb)0x0;
    if (p_Stack_40 == (uv_close_cb)0x0) goto LAB_0019a064;
    p_Stack_40 = (uv_close_cb)(long)req.service[0];
    p_Stack_48 = (uv_close_cb)0x0;
    if (p_Stack_40 == (uv_close_cb)0x0) goto LAB_0019a071;
    auStack_58._8_8_ = (uv_loop_t *)0x199ff8;
    unaff_RBX = uv_default_loop();
    auStack_58._8_8_ = (uv_loop_t *)0x19a00c;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    auStack_58._8_8_ = (uv_loop_t *)0x19a016;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    p_Stack_40 = (uv_close_cb)0x0;
    auStack_58._8_8_ = (uv_loop_t *)0x19a024;
    puVar2 = uv_default_loop();
    auStack_58._8_8_ = (uv_loop_t *)0x19a02c;
    iVar1 = uv_loop_close(puVar2);
    p_Stack_48 = (uv_close_cb)(long)iVar1;
    if (p_Stack_40 == p_Stack_48) {
      auStack_58._8_8_ = (uv_loop_t *)0x19a042;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_58._8_8_ = (uv_loop_t *)0x19a057;
    run_test_getnameinfo_basic_ip4_sync_cold_1();
LAB_0019a057:
    auStack_58._8_8_ = (uv_loop_t *)0x19a064;
    run_test_getnameinfo_basic_ip4_sync_cold_2();
LAB_0019a064:
    auStack_58._8_8_ = (uv_loop_t *)0x19a071;
    run_test_getnameinfo_basic_ip4_sync_cold_5();
LAB_0019a071:
    auStack_58._8_8_ = (uv_loop_t *)0x19a07e;
    run_test_getnameinfo_basic_ip4_sync_cold_4();
  }
  auStack_58._8_8_ = run_test_getnameinfo_basic_ip6;
  run_test_getnameinfo_basic_ip4_sync_cold_3();
  auStack_58._8_8_ = unaff_RBX;
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  auStack_58._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_58._0_8_ == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar2,&req,getnameinfo_req,(sockaddr *)&addr6,0);
    auStack_58._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_58._0_8_ == (void *)0x0) {
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_58._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((void *)auStack_58._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019a185;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_0019a185:
  handle = (uv_handle_t *)auStack_58;
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip4) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;

  r = uv_ip4_addr(address_ip4, port, &addr4);
  ASSERT_OK(r);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr4,
                     0);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}